

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O2

int client_decode_ech_config_list
              (ptls_context_t *ctx,st_decoded_ech_config_t *decoded,ptls_iovec_t config_list)

{
  uint8_t uVar1;
  bool bVar2;
  ushort uVar3;
  int iVar4;
  ulong uVar5;
  char *name;
  ulong uVar6;
  ushort *puVar7;
  ptls_hpke_cipher_suite_t *ppVar8;
  ushort *puVar9;
  ushort *puVar10;
  ptls_hpke_kem_t **pppVar11;
  ptls_hpke_kem_t *ppVar12;
  ptls_hpke_kem_t *ppVar13;
  ptls_hpke_cipher_suite_t **pppVar14;
  ushort *puVar15;
  ushort *src;
  ushort *puVar16;
  ushort *puVar17;
  ushort *puVar18;
  ptls_hpke_cipher_suite_t *ppVar19;
  bool bVar20;
  size_t local_a0;
  ushort *local_98;
  uint8_t local_90;
  size_t local_80;
  ushort *local_78;
  
  uVar6 = config_list.len;
  puVar9 = (ushort *)config_list.base;
  (decoded->bytes).base = (uint8_t *)0x0;
  (decoded->bytes).len = 0;
  (decoded->public_name).base = (uint8_t *)0x0;
  (decoded->public_name).len = 0;
  decoded->cipher = (ptls_hpke_cipher_suite_t *)0x0;
  *(undefined8 *)&decoded->max_name_length = 0;
  (decoded->public_key).base = (uint8_t *)0x0;
  (decoded->public_key).len = 0;
  *(undefined8 *)decoded = 0;
  decoded->kem = (ptls_hpke_kem_t *)0x0;
  iVar4 = 0x32;
  if ((1 < uVar6) && (uVar5 = (ulong)(ushort)(*puVar9 << 8 | *puVar9 >> 8), uVar5 <= uVar6 - 2)) {
    puVar10 = (ushort *)((long)puVar9 + uVar5 + 2);
    bVar2 = false;
    puVar18 = puVar9 + 1;
    do {
      if (((long)puVar10 - (long)puVar18 < 2) || (((long)puVar10 - (long)puVar18) - 2U < 2)) {
LAB_0011585f:
        iVar4 = 0x32;
        goto LAB_00115863;
      }
      uVar3 = puVar18[1] << 8 | puVar18[1] >> 8;
      uVar5 = (ulong)uVar3;
      src = puVar18 + 2;
      if ((ulong)((long)puVar10 - (long)src) < uVar5) goto LAB_0011585f;
      puVar15 = (ushort *)((long)puVar18 + uVar5 + 4);
      if ((ushort)(*puVar18 << 8 | *puVar18 >> 8) == 0xfe0d) {
        if (uVar5 == 0) {
          uVar1 = '\0';
LAB_001154b8:
          ppVar13 = (ptls_hpke_kem_t *)0x0;
LAB_001154ba:
          local_78 = (ushort *)0x0;
          local_80 = 0;
LAB_001154cc:
          ppVar19 = (ptls_hpke_cipher_suite_t *)0x0;
LAB_001154cf:
          local_90 = '\0';
LAB_001154d8:
          iVar4 = 0x32;
          ppVar12 = ppVar13;
          ppVar8 = ppVar19;
LAB_001154ee:
          local_98 = (ushort *)0x0;
          local_a0 = 0;
          name = (char *)0x0;
        }
        else {
          uVar1 = (uint8_t)puVar18[2];
          if (uVar3 < 3) {
            src = (ushort *)((long)puVar18 + 5);
            goto LAB_001154b8;
          }
          pppVar11 = (ctx->ech).client.kems;
          src = (ushort *)((long)puVar18 + 7);
          do {
            ppVar13 = *pppVar11;
            if (ppVar13 == (ptls_hpke_kem_t *)0x0) break;
            pppVar11 = pppVar11 + 1;
          } while (ppVar13->id !=
                   (uint16_t)
                   (*(ushort *)((long)puVar18 + 5) << 8 | *(ushort *)((long)puVar18 + 5) >> 8));
          if (uVar5 - 3 < 2) goto LAB_001154ba;
          puVar17 = (ushort *)((long)puVar18 + 9);
          local_80 = (size_t)(ushort)(*(ushort *)((long)puVar18 + 7) << 8 |
                                     *(ushort *)((long)puVar18 + 7) >> 8);
          if (uVar5 - 5 <= local_80 - 1) {
            local_80 = 0;
            local_78 = (ushort *)0x0;
            src = puVar17;
            goto LAB_001154cc;
          }
          src = (ushort *)((long)puVar17 + local_80);
          local_78 = puVar17;
          if ((ulong)((long)puVar15 - (long)src) < 2) goto LAB_001154cc;
          puVar17 = src + 1;
          uVar5 = (ulong)(ushort)(*src << 8 | *src >> 8);
          src = puVar17;
          if ((ulong)((long)puVar15 - (long)puVar17) < uVar5) goto LAB_001154cc;
          puVar7 = (ushort *)(uVar5 + (long)puVar17);
          ppVar19 = (ptls_hpke_cipher_suite_t *)0x0;
          do {
            puVar16 = puVar17;
            if ((long)puVar7 - (long)puVar16 < 2) {
              local_90 = '\0';
              src = puVar16;
              goto LAB_001154d8;
            }
            src = puVar16 + 1;
            if ((long)puVar7 - (long)src < 2) goto LAB_001154cf;
            if (ppVar19 == (ptls_hpke_cipher_suite_t *)0x0) {
              for (pppVar14 = (ctx->ech).client.ciphers; ppVar19 = *pppVar14,
                  ppVar19 != (ptls_hpke_cipher_suite_t *)0x0; pppVar14 = pppVar14 + 1) {
                if (((ppVar19->id).kdf == (uint16_t)(*puVar16 << 8 | *puVar16 >> 8)) &&
                   ((ppVar19->id).aead == (uint16_t)(puVar16[1] << 8 | puVar16[1] >> 8)))
                goto LAB_001156a4;
              }
              ppVar19 = (ptls_hpke_cipher_suite_t *)0x0;
            }
LAB_001156a4:
            src = puVar16 + 2;
            puVar17 = src;
          } while (src != puVar7);
          if (puVar7 == puVar15) goto LAB_001154cf;
          local_90 = (uint8_t)puVar16[2];
          src = (ushort *)((long)puVar16 + 5);
          if ((ushort *)((long)puVar16 + 5) == puVar15) goto LAB_001154d8;
          uVar5 = (ulong)*(byte *)((long)puVar16 + 5);
          src = puVar16 + 3;
          if (((ulong)((long)puVar15 - (long)src) < uVar5) || (uVar5 == 0)) goto LAB_001154d8;
          name = duplicate_as_str(src,uVar5);
          if (name == (char *)0x0) {
            iVar4 = 0x201;
            ppVar12 = ppVar13;
            ppVar8 = ppVar19;
            goto LAB_001154ee;
          }
          iVar4 = ptls_server_name_is_ipaddr(name);
          ppVar8 = (ptls_hpke_cipher_suite_t *)0x0;
          ppVar12 = (ptls_hpke_kem_t *)0x0;
          local_98 = (ushort *)0x0;
          local_a0 = 0;
          if (iVar4 == 0) {
            ppVar8 = ppVar19;
            ppVar12 = ppVar13;
            local_98 = src;
            local_a0 = uVar5;
          }
          puVar17 = (ushort *)((long)src + uVar5);
          if ((ulong)((long)puVar15 - (long)puVar17) < 2) {
LAB_00115770:
            iVar4 = 0x32;
            src = puVar17;
          }
          else {
            src = puVar17 + 1;
            uVar5 = (ulong)(ushort)(*puVar17 << 8 | *puVar17 >> 8);
            puVar17 = src;
            if ((ulong)((long)puVar15 - (long)src) < uVar5) goto LAB_00115770;
            puVar7 = (ushort *)(uVar5 + (long)src);
            while (src < puVar7) {
              puVar17 = src;
              if (((long)puVar7 - (long)src < 2) ||
                 (puVar17 = src + 1, (ulong)((long)puVar7 - (long)(src + 1)) < 2))
              goto LAB_00115770;
              puVar17 = src + 2;
              uVar5 = (ulong)(ushort)(src[1] << 8 | src[1] >> 8);
              if ((ulong)((long)puVar7 - (long)puVar17) < uVar5) goto LAB_00115770;
              puVar17 = (ushort *)((long)puVar17 + uVar5);
              uVar3 = *src;
              src = puVar17;
              if ((char)uVar3 < '\0') {
                ppVar12 = (ptls_hpke_kem_t *)0x0;
                ppVar8 = (ptls_hpke_cipher_suite_t *)0x0;
              }
            }
            iVar4 = 0x32;
            if (puVar7 == puVar15 && src == puVar7) {
              iVar4 = 0;
            }
          }
        }
        free(name);
        if (iVar4 != 0) goto LAB_00115863;
        if (((!bVar2) && (ppVar12 != (ptls_hpke_kem_t *)0x0)) &&
           (ppVar8 != (ptls_hpke_cipher_suite_t *)0x0)) {
          decoded->id = uVar1;
          *(undefined4 *)&decoded->field_0x4 = 0;
          *(undefined4 *)&decoded->field_0x1 = 0;
          decoded->kem = ppVar12;
          (decoded->public_key).base = (uint8_t *)local_78;
          (decoded->public_key).len = local_80;
          decoded->cipher = ppVar8;
          decoded->max_name_length = local_90;
          *(undefined4 *)&decoded->field_0x2c = 0;
          *(undefined4 *)&decoded->field_0x29 = 0;
          (decoded->public_name).base = (uint8_t *)local_98;
          (decoded->public_name).len = local_a0;
          (decoded->bytes).base = (uint8_t *)puVar18;
          (decoded->bytes).len = (long)puVar15 - (long)puVar18;
          bVar2 = true;
        }
        bVar20 = src != puVar15;
        puVar15 = src;
        if (bVar20) goto LAB_0011585f;
      }
      puVar18 = puVar15;
    } while (puVar15 != puVar10);
    iVar4 = 0x32;
    if (puVar10 == (ushort *)(uVar6 + (long)puVar9)) {
      return 0;
    }
  }
LAB_00115863:
  (decoded->bytes).base = (uint8_t *)0x0;
  (decoded->bytes).len = 0;
  (decoded->public_name).base = (uint8_t *)0x0;
  (decoded->public_name).len = 0;
  decoded->cipher = (ptls_hpke_cipher_suite_t *)0x0;
  *(undefined8 *)&decoded->max_name_length = 0;
  (decoded->public_key).base = (uint8_t *)0x0;
  (decoded->public_key).len = 0;
  *(undefined8 *)decoded = 0;
  decoded->kem = (ptls_hpke_kem_t *)0x0;
  return iVar4;
}

Assistant:

static int client_decode_ech_config_list(ptls_context_t *ctx, struct st_decoded_ech_config_t *decoded, ptls_iovec_t config_list)
{
    const uint8_t *src = config_list.base, *const end = src + config_list.len;
    int match_found = 0, ret;

    *decoded = (struct st_decoded_ech_config_t){0};

    ptls_decode_block(src, end, 2, {
        do {
            const uint8_t *config_start = src;
            uint16_t version;
            if ((ret = ptls_decode16(&version, &src, end)) != 0)
                goto Exit;
            ptls_decode_open_block(src, end, 2, {
                /* If the block is the one that we recognize, parse it, then adopt if if possible. Otherwise, skip. */
                if (version == PTLS_ECH_CONFIG_VERSION) {
                    struct st_decoded_ech_config_t thisconf;
                    if ((ret = decode_one_ech_config(ctx->ech.client.kems, ctx->ech.client.ciphers, &thisconf, &src, end)) != 0)
                        goto Exit;
                    if (!match_found && thisconf.kem != NULL && thisconf.cipher != NULL) {
                        *decoded = thisconf;
                        decoded->bytes = ptls_iovec_init(config_start, end - config_start);
                        match_found = 1;
                    }
                } else {
                    src = end;
                }
            });
        } while (src != end);
    });
    ret = 0;

Exit:
    if (ret != 0)
        *decoded = (struct st_decoded_ech_config_t){0};
    return ret;
}